

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O3

long contained_cost(obj *obj,monst *shkp,long price,boolean usell,boolean unpaid_only)

{
  obj *obj_00;
  boolean bVar1;
  long lVar2;
  
  for (obj_00 = obj->cobj; obj_00 != (obj *)0x0; obj_00 = obj_00->nobj) {
    if (obj_00->oclass != '\f') {
      if (usell == '\0') {
        if (((*(uint *)&obj_00->field_0x4a & 8) == 0) &&
           ((unpaid_only == '\0' || ((*(uint *)&obj_00->field_0x4a & 4) != 0)))) {
          lVar2 = get_cost(obj_00,shkp);
          price = price + obj_00->quan * lVar2;
        }
      }
      else {
        bVar1 = saleable(shkp,obj_00);
        if ((((bVar1 != '\0') && ((obj_00->field_0x4a & 4) == 0)) && (obj_00->oclass != '\x0f')) &&
           (((obj_00->oclass != '\a' || (obj_00->oeaten == 0)) &&
            ((1 < (ushort)(obj_00->otyp - 0xe5U) ||
             ((long)objects[(ushort)obj_00->otyp].oc_cost * 0x14 <= (long)obj_00->age)))))) {
          lVar2 = set_cost(obj_00,shkp);
          price = price + lVar2;
        }
      }
      if (obj_00->cobj != (obj *)0x0) {
        lVar2 = contained_cost(obj_00,shkp,price,usell,unpaid_only);
        price = price + lVar2;
      }
    }
  }
  return price;
}

Assistant:

long contained_cost(const struct obj *obj, struct monst *shkp, long price,
		    boolean usell, boolean unpaid_only)
{
	struct obj *otmp;

	/* the price of contained objects */
	for (otmp = obj->cobj; otmp; otmp = otmp->nobj) {
	    if (otmp->oclass == COIN_CLASS) continue;
	    /* the "top" container is evaluated by caller */
	    if (usell) {
		if (saleable(shkp, otmp) &&
			!otmp->unpaid && otmp->oclass != BALL_CLASS &&
			!(otmp->oclass == FOOD_CLASS && otmp->oeaten) &&
			!(Is_candle(otmp) && otmp->age <
				20L * (long)objects[otmp->otyp].oc_cost))
		    price += set_cost(otmp, shkp);
	    } else if (!otmp->no_charge &&
		      (!unpaid_only || (unpaid_only && otmp->unpaid))) {
		    price += get_cost(otmp, shkp) * otmp->quan;
	    }

	    if (Has_contents(otmp))
		    price += contained_cost(otmp, shkp, price, usell, unpaid_only);
	}

	return price;
}